

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQObject __thiscall SQFuncState::CreateTable(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  SQObject SVar4;
  SQObjectPtr nt;
  SQObjectPtr local_30;
  SQObjectPtr local_20;
  
  local_20.super_SQObject._unVal.pTable = SQTable::Create(this->_sharedstate,0);
  local_20.super_SQObject._type = OT_TABLE;
  pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_30.super_SQObject._type = OT_INTEGER;
  local_30.super_SQObject._unVal.nInteger = 1;
  SQTable::NewSlot((this->_strings).super_SQObject._unVal.pTable,&local_20,&local_30);
  SQObjectPtr::~SQObjectPtr(&local_30);
  SVar3 = local_20.super_SQObject._unVal;
  SVar2 = local_20.super_SQObject._type;
  SQObjectPtr::~SQObjectPtr(&local_20);
  SVar4._4_4_ = 0;
  SVar4._type = SVar2;
  SVar4._unVal.pTable = SVar3.pTable;
  return SVar4;
}

Assistant:

SQObject SQFuncState::CreateTable()
{
    SQObjectPtr nt(SQTable::Create(_sharedstate,0));
    _table(_strings)->NewSlot(nt,(SQInteger)1);
    return nt;
}